

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_psbt.cpp
# Opt level: O0

void __thiscall
cfdcapi_psbt_ConvertPsbtFromTx_Test::TestBody(cfdcapi_psbt_ConvertPsbtFromTx_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  uint32_t in_stack_00000178;
  uint32_t in_stack_0000017c;
  char *in_stack_00000180;
  AssertionResult gtest_ar_8;
  void *in_stack_00000198;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  uint32_t txout_count;
  uint32_t txin_count;
  uint32_t psbt_version;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *output;
  char *exp_psbt_base64;
  char *exp_psbt_tx;
  void *psbt_handle;
  int net_type;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffc88;
  undefined8 *puVar3;
  AssertionResult *in_stack_fffffffffffffc90;
  CfdErrorCode *in_stack_fffffffffffffc98;
  char *in_stack_fffffffffffffca0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  char *in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd48;
  AssertHelper local_250;
  Message local_248;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  char **in_stack_fffffffffffffdc8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffdd0;
  AssertHelper in_stack_fffffffffffffdd8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  AssertHelper local_130;
  Message local_128;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d4;
  AssertionResult local_d0;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x381c7a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xcf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x381cdd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x381d32);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,(type *)0x381d66);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xd0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x381e62);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x381edd);
  local_9c = 1;
  local_a8 = 0;
  local_b0 = 
  "0200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000"
  ;
  local_b8 = 
  "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAAAAAAAAAAAAA=="
  ;
  local_c0 = (char *)0x0;
  puVar3 = &local_a8;
  local_14 = CfdCreatePsbtHandle(in_stack_00000198,gtest_ar_8.message_.ptr_._4_4_,
                                 (char *)gtest_ar_8._0_8_,in_stack_00000180,in_stack_0000017c,
                                 in_stack_00000178,(void **)gtest_ar_7._0_8_);
  local_d4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
             in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382009);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xd9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x38206c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3820c4);
  if (local_14 == 0) {
    local_14 = CfdGetPsbtData(in_stack_fffffffffffffdd8.data_,in_stack_fffffffffffffdd0.ptr_,
                              in_stack_fffffffffffffdc8,
                              (char **)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0)
                             );
    local_fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3821a7);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xdc,pcVar2);
      testing::internal::AssertHelper::operator=(&local_110,&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::Message::~Message((Message *)0x38220a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x38225f);
    if (local_14 == 0) {
      in_stack_fffffffffffffd48 = &local_120;
      testing::internal::CmpHelperSTREQ
                ((internal *)in_stack_fffffffffffffd48,"exp_psbt_base64","output",local_b8,local_c0)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffd48);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        in_stack_fffffffffffffd40 =
             testing::AssertionResult::failure_message((AssertionResult *)0x38230f);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xde,in_stack_fffffffffffffd40);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message((Message *)0x382372);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3823c7);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc98);
      local_c0 = (char *)0x0;
    }
    local_134 = 0;
    local_138 = 0;
    local_13c = 0;
    local_14 = CfdGetPsbtGlobalData
                         ((void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                          in_stack_fffffffffffffde0.ptr_,&(in_stack_fffffffffffffdd8.data_)->type,
                          (char **)in_stack_fffffffffffffdd0.ptr_,
                          (uint32_t *)in_stack_fffffffffffffdc8,
                          (uint32_t *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0))
    ;
    local_154 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
    if (!bVar1) {
      testing::Message::Message(&local_160);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3824ec);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xe8,pcVar2);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message((Message *)0x38254f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3825a7);
    if (local_14 == 0) {
      local_17c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (uint *)in_stack_fffffffffffffc90,puVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
      if (!bVar1) {
        testing::Message::Message(&local_188);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382667);
        testing::internal::AssertHelper::AssertHelper
                  (&local_190,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xea,pcVar2);
        testing::internal::AssertHelper::operator=(&local_190,&local_188);
        testing::internal::AssertHelper::~AssertHelper(&local_190);
        testing::Message::~Message((Message *)0x3826ca);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x38271f);
      local_1a4 = 6;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (uint *)in_stack_fffffffffffffc90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
      if (!bVar1) {
        testing::Message::Message(&local_1b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3827c6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xeb,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b8);
        testing::Message::~Message((Message *)0x382823);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x382878);
      local_1cc = 2;
      testing::internal::EqHelper<false>::Compare<int,unsigned_int>
                ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                 (uint *)in_stack_fffffffffffffc90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382919);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1e0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xec,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper(&local_1e0);
        testing::Message::~Message((Message *)0x382976);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3829cb);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_1f0,"exp_psbt_tx","output",local_b0,local_c0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382a61);
        testing::internal::AssertHelper::AssertHelper
                  (&local_200,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                   ,0xed,pcVar2);
        testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper(&local_200);
        testing::Message::~Message((Message *)0x382abe);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x382b13);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffc98);
      local_c0 = (char *)0x0;
    }
    local_14 = CfdFreePsbtHandle(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
               in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffde0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382beb);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffdd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
                 ,0xf3,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffdd8,(Message *)&stack0xfffffffffffffde0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdd8);
      testing::Message::~Message((Message *)0x382c48);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x382c9d);
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffc98);
  this_00 = (AssertionResult *)&stack0xfffffffffffffdc8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),(char *)this_00,
             in_stack_fffffffffffffc98,(int *)in_stack_fffffffffffffc90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x382d54);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_psbt.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message((Message *)0x382db1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x382e06);
  return;
}

Assistant:

TEST(cfdcapi_psbt, ConvertPsbtFromTx) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  int net_type = kCfdNetworkTestnet;
  void* psbt_handle = nullptr;
  const char* exp_psbt_tx = "0200000006f834da7cb5e183fc815f7846227284660fa4a0a583be2bfb4a535bf425e531de0100000000ffffffff5aef6a3bce7624951ae5b9e8c0908e8ff74721eedf7a0994d5bf1efc7dee82810200000000ffffffffa92dd64952789efd1444938e9ce5b106e7280089c4dc4a78b3da7c7a2b69d93f0300000000fffffffffcf72c7bb8881945955e48f54e6081b51901836484e5c48a9925061029c405d10400000000ffffffffa0be1a4d9a22c832d2d20a3a084f010d09a9ab41fb3e2dedbd46eb0104578fb90500000000ffffffff71a141bf5b653e2c43773305d69a8c9876944470ca1e29e4b03a0953c4beb6950100000000ffffffff0280f0fa0200000000160014b322bddce633b851ac7370ab454f0b367a0654e580f0fa0200000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000";
  const char* exp_psbt_base64 = "cHNidP8BAP0+AQIAAAAG+DTafLXhg/yBX3hGInKEZg+koKWDviv7SlNb9CXlMd4BAAAAAP////9a72o7znYklRrluejAkI6P90ch7t96CZTVvx78fe6CgQIAAAAA/////6kt1klSeJ79FESTjpzlsQbnKACJxNxKeLPafHoradk/AwAAAAD//////Pcse7iIGUWVXkj1TmCBtRkBg2SE5cSKmSUGECnEBdEEAAAAAP////+gvhpNmiLIMtLSCjoITwENCamrQfs+Le29RusBBFePuQUAAAAA/////3GhQb9bZT4sQ3czBdaajJh2lERwyh4p5LA6CVPEvraVAQAAAAD/////AoDw+gIAAAAAFgAUsyK93OYzuFGsc3CrRU8LNnoGVOWA8PoCAAAAABYAFMq4xTpuj8ApbRzTkVowfVHEkaVVAAAAAAAAAAAAAAAAAA==";
  char* output = nullptr;
  ret = CfdCreatePsbtHandle(
    handle, net_type, "", exp_psbt_tx, 0, 0, &psbt_handle);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    ret = CfdGetPsbtData(handle, psbt_handle, &output, nullptr);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(exp_psbt_base64, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    uint32_t psbt_version = 0;
    uint32_t txin_count = 0;
    uint32_t txout_count = 0;
    ret = CfdGetPsbtGlobalData(handle, psbt_handle, &psbt_version,
        &output, &txin_count, &txout_count);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(0, psbt_version);
      EXPECT_EQ(6, txin_count);
      EXPECT_EQ(2, txout_count);
      EXPECT_STREQ(exp_psbt_tx, output);
      CfdFreeStringBuffer(output);
      output = nullptr;
    }

    ret = CfdFreePsbtHandle(handle, psbt_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}